

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

void __thiscall
BmsParseInvalidCharAsHeaderKeyException::BmsParseInvalidCharAsHeaderKeyException
          (BmsParseInvalidCharAsHeaderKeyException *this,uint line,string *str)

{
  BmsParseInvalidCharException::BmsParseInvalidCharException
            (&this->super_BmsParseInvalidCharException,line,str);
  (this->super_BmsParseInvalidCharException).super_BmsParseException.super_BmsException.
  _vptr_BmsException = (_func_int **)&PTR_Message_abi_cxx11__00144560;
  return;
}

Assistant:

BmsParseInvalidCharAsHeaderKeyException::BmsParseInvalidCharAsHeaderKeyException( unsigned int line, const std::string& str ) :
BmsParseInvalidCharException( line, str )
{
}